

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O1

int sys_flushtogui(void)

{
  int *piVar1;
  char *__dest;
  _instanceinter *p_Var2;
  _instanceinter *p_Var3;
  uint uVar4;
  int iVar5;
  
  iVar5 = (pd_maininstance.pd_inter)->i_guitail;
  uVar4 = (pd_maininstance.pd_inter)->i_guihead - iVar5;
  if (uVar4 == 0 || (pd_maininstance.pd_inter)->i_guihead < iVar5) {
    p_Var3 = (_instanceinter *)0x0;
  }
  else {
    p_Var3 = (_instanceinter *)
             send((pd_maininstance.pd_inter)->i_guisock,(pd_maininstance.pd_inter)->i_guibuf + iVar5
                  ,(ulong)uVar4,0);
  }
  p_Var2 = pd_maininstance.pd_inter;
  iVar5 = (int)p_Var3;
  if (-1 < iVar5) {
    if (iVar5 != 0) {
      piVar1 = &(pd_maininstance.pd_inter)->i_guihead;
      if (iVar5 < *piVar1 - (pd_maininstance.pd_inter)->i_guitail) {
        iVar5 = (pd_maininstance.pd_inter)->i_guitail + iVar5;
        (pd_maininstance.pd_inter)->i_guitail = iVar5;
        uVar4 = p_Var2->i_guisize >> 2;
        p_Var3 = (_instanceinter *)(ulong)uVar4;
        if ((int)uVar4 < iVar5) {
          __dest = p_Var2->i_guibuf;
          memmove(__dest,__dest + iVar5,(long)(*piVar1 - iVar5));
          p_Var3 = pd_maininstance.pd_inter;
          (pd_maininstance.pd_inter)->i_guihead =
               (pd_maininstance.pd_inter)->i_guihead - (pd_maininstance.pd_inter)->i_guitail;
          p_Var3->i_guitail = 0;
        }
      }
      else {
        p_Var2->i_guihead = 0;
        p_Var2->i_guitail = 0;
      }
    }
    return (int)p_Var3;
  }
  sys_flushtogui_cold_1();
  return -1;
}

Assistant:

static int sys_flushtogui(void)
{
    int writesize = INTER->i_guihead - INTER->i_guitail,
        nwrote = 0;
    if (writesize > 0)
        nwrote = (int)send(
            INTER->i_guisock,
            INTER->i_guibuf + INTER->i_guitail,
            writesize, 0);

#if 0
    if (writesize)
        fprintf(stderr, "wrote %d of %d\n", nwrote, writesize);
#endif

    if (nwrote < 0)
    {
        perror("pd-to-gui socket");
        sys_bail(1);
    }
    else if (!nwrote)
        return (0);
    else if (nwrote >= INTER->i_guihead - INTER->i_guitail)
        INTER->i_guihead = INTER->i_guitail = 0;
    else if (nwrote)
    {
        INTER->i_guitail += nwrote;
        if (INTER->i_guitail > (INTER->i_guisize >> 2))
        {
            memmove(INTER->i_guibuf,
                INTER->i_guibuf  + INTER->i_guitail,
                INTER->i_guihead - INTER->i_guitail);
            INTER->i_guihead = INTER->i_guihead - INTER->i_guitail;
            INTER->i_guitail = 0;
        }
    }
    return (1);
}